

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httpserver.cpp
# Opt level: O1

void StartHTTPServer(void)

{
  int64_t iVar1;
  int64_t iVar2;
  long in_FS_OFFSET;
  string_view source_file;
  string_view logging_function;
  int local_50;
  int rpcThreads;
  string local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"-rpcthreads","");
  iVar1 = ArgsManager::GetIntArg(&gArgs,&local_48,4);
  iVar2 = 1;
  if (1 < iVar1) {
    iVar2 = iVar1;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  rpcThreads = (int)iVar2;
  source_file._M_str =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/httpserver.cpp"
  ;
  source_file._M_len = 0x5e;
  logging_function._M_str = "StartHTTPServer";
  logging_function._M_len = 0xf;
  LogPrintFormatInternal<int>
            (logging_function,source_file,500,ALL,Info,(ConstevalFormatString<1U>)0xf9123b,
             &rpcThreads);
  std::thread::thread<void(&)(event_base*),event_base*&,void>
            ((thread *)&local_48,ThreadHTTP,&eventBase);
  if (g_thread_http._M_id._M_thread != 0) {
    std::terminate();
  }
  g_thread_http._M_id._M_thread = (id)(id)local_48._M_dataplus._M_p;
  local_50 = 0;
  if (0 < rpcThreads) {
    do {
      local_48._M_dataplus._M_p =
           (pointer)g_work_queue._M_t.
                    super___uniq_ptr_impl<WorkQueue<HTTPClosure>,_std::default_delete<WorkQueue<HTTPClosure>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_WorkQueue<HTTPClosure>_*,_std::default_delete<WorkQueue<HTTPClosure>_>_>
                    .super__Head_base<0UL,_WorkQueue<HTTPClosure>_*,_false>._M_head_impl;
      std::vector<std::thread,std::allocator<std::thread>>::
      emplace_back<void(&)(WorkQueue<HTTPClosure>*,int),WorkQueue<HTTPClosure>*,int&>
                ((vector<std::thread,std::allocator<std::thread>> *)&g_thread_http_workers,
                 HTTPWorkQueueRun,(WorkQueue<HTTPClosure> **)&local_48,&local_50);
      local_50 = local_50 + 1;
    } while (local_50 < rpcThreads);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void StartHTTPServer()
{
    int rpcThreads = std::max((long)gArgs.GetIntArg("-rpcthreads", DEFAULT_HTTP_THREADS), 1L);
    LogInfo("Starting HTTP server with %d worker threads\n", rpcThreads);
    g_thread_http = std::thread(ThreadHTTP, eventBase);

    for (int i = 0; i < rpcThreads; i++) {
        g_thread_http_workers.emplace_back(HTTPWorkQueueRun, g_work_queue.get(), i);
    }
}